

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O1

void __thiscall
el::base::Writer::initializeLogger(Writer *this,string *loggerId,bool lookup,bool needLock)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  Level LVar3;
  TypedConfigurations *pTVar4;
  RegisteredLoggers *pRVar5;
  char *__s;
  Logger *pLVar6;
  mapped_type *pmVar7;
  Writer *pWVar8;
  size_t sVar9;
  _Base_ptr p_Var10;
  undefined7 in_register_00000011;
  _Base_ptr p_Var11;
  undefined1 *puVar12;
  bool bVar13;
  byte bVar14;
  undefined1 local_98 [32];
  char *local_78;
  VerboseLevel local_70;
  Logger *local_68;
  bool local_60;
  Logger *local_58;
  char *local_50;
  DispatchAction local_48;
  pointer local_40;
  pointer pbStack_38;
  pointer local_30;
  
  if ((int)CONCAT71(in_register_00000011,lookup) != 0) {
    pLVar6 = RegisteredLoggers::get
                       ((RegisteredLoggers *)elStorage[3],loggerId,
                        (bool)((byte)((ushort)(short)elStorage[4] >> 0xc) & 1));
    this->m_logger = pLVar6;
  }
  if (this->m_logger == (Logger *)0x0) {
    (**(code **)*elStorage)();
    pRVar5 = (RegisteredLoggers *)elStorage[3];
    pcVar2 = local_98 + 0x10;
    local_98._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"default","");
    pLVar6 = RegisteredLoggers::get(pRVar5,(string *)local_98,false);
    if ((pointer)local_98._0_8_ != pcVar2) {
      operator_delete((void *)local_98._0_8_);
    }
    if (pLVar6 == (Logger *)0x0) {
      pRVar5 = (RegisteredLoggers *)elStorage[3];
      local_98._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"default","");
      RegisteredLoggers::get(pRVar5,(string *)local_98,true);
      if ((pointer)local_98._0_8_ != pcVar2) {
        operator_delete((void *)local_98._0_8_);
      }
    }
    (**(code **)(*elStorage + 8))();
    local_98._16_8_ = this->m_file;
    local_98._24_8_ = this->m_line;
    local_78 = this->m_func;
    local_98._0_8_ = &PTR__Writer_00164080;
    local_98._8_2_ = Debug;
    local_70 = 0;
    local_68 = (Logger *)0x0;
    local_60 = false;
    local_58 = (Logger *)0x0;
    local_50 = "";
    local_48 = NormalLog;
    local_40 = (pointer)0x0;
    pbStack_38 = (pointer)0x0;
    local_30 = (pointer)0x0;
    pWVar8 = construct((Writer *)local_98,1,"default");
    if ((pWVar8->m_proceed == true) &&
       (std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&((pWVar8->m_messageBuilder).m_logger)->field_0x50,"Logger [",8),
       (*(byte *)((long)elStorage + 0x21) & 0x20) != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&((pWVar8->m_messageBuilder).m_logger)->field_0x50," ",1);
    }
    if (pWVar8->m_proceed == true) {
      __s = (loggerId->_M_dataplus)._M_p;
      puVar12 = &((pWVar8->m_messageBuilder).m_logger)->field_0x50;
      if (__s == (char *)0x0) {
        std::ios::clear((int)puVar12 + (int)*(undefined8 *)(*(long *)puVar12 + -0x18));
      }
      else {
        sVar9 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar12,__s,sVar9);
      }
      if ((*(byte *)((long)elStorage + 0x21) & 0x20) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&((pWVar8->m_messageBuilder).m_logger)->field_0x50," ",1);
      }
    }
    if ((pWVar8->m_proceed == true) &&
       (std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&((pWVar8->m_messageBuilder).m_logger)->field_0x50,
                   "] is not registered yet!",0x18), (*(byte *)((long)elStorage + 0x21) & 0x20) != 0
       )) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&((pWVar8->m_messageBuilder).m_logger)->field_0x50," ",1);
    }
    ~Writer((Writer *)local_98);
    this->m_proceed = false;
    return;
  }
  if (needLock) {
    (**(this->m_logger->super_ThreadSafe)._vptr_ThreadSafe)();
  }
  if ((*(byte *)((long)elStorage + 0x21) & 8) == 0) {
    LVar3 = this->m_level;
    pTVar4 = this->m_logger->m_typedConfigurations;
    (*(pTVar4->super_ThreadSafe)._vptr_ThreadSafe[2])(pTVar4);
    p_Var1 = &(pTVar4->m_enabledMap)._M_t._M_impl.super__Rb_tree_header;
    p_Var11 = (pTVar4->m_enabledMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var10 = &p_Var1->_M_header;
    for (; p_Var11 != (_Base_ptr)0x0; p_Var11 = (&p_Var11->_M_left)[bVar13]) {
      bVar13 = (Level)p_Var11[1]._M_color < LVar3;
      if (!bVar13) {
        p_Var10 = p_Var11;
      }
    }
    p_Var11 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var10 != p_Var1) &&
       (p_Var11 = p_Var10, LVar3 < (Level)p_Var10[1]._M_color)) {
      p_Var11 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var11 != p_Var1) {
LAB_0013baad:
      bVar14 = *(byte *)((long)&p_Var11[1]._M_color + 2);
      goto LAB_0013bb6c;
    }
    local_98._0_2_ = 1;
    pmVar7 = std::
             map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
             ::at(&pTVar4->m_enabledMap,(key_type *)local_98);
  }
  else {
    if (this->m_level != Verbose) {
      bVar14 = *(Level *)(elStorage + 0x25) <= this->m_level;
      goto LAB_0013bb6c;
    }
    pTVar4 = this->m_logger->m_typedConfigurations;
    (*(pTVar4->super_ThreadSafe)._vptr_ThreadSafe[2])(pTVar4);
    p_Var1 = &(pTVar4->m_enabledMap)._M_t._M_impl.super__Rb_tree_header;
    p_Var11 = (pTVar4->m_enabledMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var10 = &p_Var1->_M_header;
    for (; p_Var11 != (_Base_ptr)0x0; p_Var11 = (&p_Var11->_M_left)[bVar13]) {
      bVar13 = (ushort)(short)p_Var11[1]._M_color < 0x40;
      if (!bVar13) {
        p_Var10 = p_Var11;
      }
    }
    p_Var11 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var10 != p_Var1) &&
       (p_Var11 = p_Var10, 0x40 < (ushort)(short)p_Var10[1]._M_color)) {
      p_Var11 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var11 != p_Var1) goto LAB_0013baad;
    local_98._0_2_ = 1;
    pmVar7 = std::
             map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
             ::at(&pTVar4->m_enabledMap,(key_type *)local_98);
  }
  bVar14 = *pmVar7;
LAB_0013bb6c:
  this->m_proceed = (bool)bVar14;
  return;
}

Assistant:

void initializeLogger(const std::string& loggerId, bool lookup = true, bool needLock = true) {
    if (lookup) {
      m_logger = ELPP->registeredLoggers()->get(loggerId, ELPP->hasFlag(LoggingFlag::CreateLoggerAutomatically));
    }
    if (m_logger == nullptr) {
      ELPP->acquireLock();
      if (!ELPP->registeredLoggers()->has(std::string(base::consts::kDefaultLoggerId))) {
        // Somehow default logger has been unregistered. Not good! Register again
        ELPP->registeredLoggers()->get(std::string(base::consts::kDefaultLoggerId));
      }
      ELPP->releaseLock();  // Need to unlock it for next writer
      Writer(Level::Debug, m_file, m_line, m_func).construct(1, base::consts::kDefaultLoggerId)
          << "Logger [" << loggerId << "] is not registered yet!";
      m_proceed = false;
    } else {
      if (needLock) {
        m_logger->acquireLock();  // This should not be unlocked by checking m_proceed because
        // m_proceed can be changed by lines below
      }
      if (ELPP->hasFlag(LoggingFlag::HierarchicalLogging)) {
        m_proceed = m_level == Level::Verbose ? m_logger->enabled(m_level) :
                    LevelHelper::castToInt(m_level) >= LevelHelper::castToInt(ELPP->m_loggingLevel);
      } else {
        m_proceed = m_logger->enabled(m_level);
      }
    }
  }